

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  float fVar1;
  ImGuiWindow *root_payload;
  ImGuiTabBar *pIVar2;
  ImGuiContext *ctx;
  bool bVar3;
  bool is_explicit_target;
  ImGuiPayload *pIVar4;
  ImGuiDockNode *host_node;
  ImGuiDockNode *node;
  ImGuiDockNode *host_node_00;
  ImGuiDockPreviewData *pIVar5;
  ImRect explicit_target_rect;
  ImGuiDockPreviewData split_outer;
  ImGuiDockPreviewData split_inner;
  
  ctx = GImGui;
  if (GImGui->DragDropActive == true) {
    split_inner.FutureNode._0_16_ = ImGuiWindow::Rect(window);
    bVar3 = BeginDragDropTargetCustom((ImRect *)&split_inner,window->ID);
    if (bVar3) {
      bVar3 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW");
      if (bVar3) {
        root_payload = *(ctx->DragDropPayload).Data;
        bVar3 = DockNodeIsDropAllowed(window,root_payload);
        if ((bVar3) &&
           (pIVar4 = AcceptDragDropPayload("_IMWINDOW",0xc00), pIVar4 != (ImGuiPayload *)0x0)) {
          if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
            host_node = window->DockNode;
            bVar3 = host_node == (ImGuiDockNode *)0x0;
          }
          else {
            host_node = DockNodeTreeFindNodeByPos(window->DockNodeAsHost,(ctx->IO).MousePos);
            bVar3 = false;
          }
          if (((host_node == (ImGuiDockNode *)0x0) ||
              (pIVar2 = host_node->TabBar, pIVar2 == (ImGuiTabBar *)0x0)) ||
             ((host_node->LocalFlags & 0x3000) != 0)) {
            fVar1 = (GImGui->Style).FramePadding.y;
            explicit_target_rect.Min = window->Pos;
            explicit_target_rect.Max.y = fVar1 + fVar1 + GImGui->FontSize + (window->Pos).y;
            explicit_target_rect.Max.x = (window->Size).x + (window->Pos).x;
          }
          else {
            explicit_target_rect.Min = (pIVar2->BarRect).Min;
            explicit_target_rect.Max = (pIVar2->BarRect).Max;
          }
          is_explicit_target = true;
          if ((ctx->IO).ConfigDockingWithShift == false) {
            is_explicit_target =
                 IsMouseHoveringRect(&explicit_target_rect.Min,&explicit_target_rect.Max,true);
          }
          if ((((ctx->DragDropPayload).Preview != false) ||
              ((ctx->DragDropPayload).Delivery == true)) &&
             ((bool)(host_node != (ImGuiDockNode *)0x0 | bVar3))) {
            ImGuiDockPreviewData::ImGuiDockPreviewData(&split_inner);
            ImGuiDockPreviewData::ImGuiDockPreviewData(&split_outer);
            pIVar5 = &split_inner;
            if (((host_node != (ImGuiDockNode *)0x0) &&
                ((host_node->ParentNode != (ImGuiDockNode *)0x0 ||
                 ((host_node->LocalFlags & 0x800) != 0)))) &&
               (host_node_00 = DockNodeGetRootNode(node), host_node_00 != (ImGuiDockNode *)0x0)) {
              DockNodePreviewDockSetup
                        (window,host_node_00,root_payload,&split_outer,is_explicit_target,true);
              pIVar5 = &split_inner;
              if (split_outer.IsSplitDirExplicit != false) {
                pIVar5 = &split_outer;
              }
            }
            DockNodePreviewDockSetup
                      (window,host_node,root_payload,&split_inner,is_explicit_target,false);
            if (pIVar5 == &split_outer) {
              split_inner.IsDropAllowed = false;
            }
            DockNodePreviewDockRender(window,host_node,root_payload,&split_inner);
            DockNodePreviewDockRender(window,host_node,root_payload,&split_outer);
            if ((pIVar5->IsDropAllowed == true) && ((ctx->DragDropPayload).Delivery == true)) {
              DockContextQueueDock
                        (ctx,window,pIVar5->SplitNode,root_payload,pIVar5->SplitDir,
                         pIVar5->SplitRatio,pIVar5 == &split_outer);
            }
            ImGuiDockNode::~ImGuiDockNode(&split_outer.FutureNode);
            ImGuiDockNode::~ImGuiDockNode(&split_inner.FutureNode);
          }
        }
      }
      GImGui->DragDropWithinSourceOrTarget = false;
    }
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindow == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        ImGuiDockNode* node = NULL;
        bool allow_null_target_node = false;
        if (window->DockNodeAsHost)
            node = DockNodeTreeFindNodeByPos(window->DockNodeAsHost, g.IO.MousePos);
        else if (window->DockNode) // && window->DockIsActive)
            node = window->DockNode;
        else
            allow_null_target_node = true; // Dock into a regular window

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || allow_null_target_node))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}